

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void signal_parse_sb_row_done(AV1Decoder *pbi,TileDataDec *tile_data,int sb_mi_size)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  AV1DecRowMTInfo *frame_row_mt_info;
  
  pthread_mutex_lock(*(pthread_mutex_t **)(in_RDI + 0x5f6e0));
  *(int *)(in_RSI + 0x5390) = in_EDX + *(int *)(in_RSI + 0x5390);
  *(int *)(in_RDI + 0x5f70c) = in_EDX + *(int *)(in_RDI + 0x5f70c);
  pthread_cond_signal(*(pthread_cond_t **)(in_RDI + 0x5f6e8));
  pthread_mutex_unlock(*(pthread_mutex_t **)(in_RDI + 0x5f6e0));
  return;
}

Assistant:

static inline void signal_parse_sb_row_done(AV1Decoder *const pbi,
                                            TileDataDec *const tile_data,
                                            const int sb_mi_size) {
  AV1DecRowMTInfo *frame_row_mt_info = &pbi->frame_row_mt_info;
#if CONFIG_MULTITHREAD
  pthread_mutex_lock(pbi->row_mt_mutex_);
#endif
  assert(frame_row_mt_info->mi_rows_parse_done >=
         frame_row_mt_info->mi_rows_decode_started);
  tile_data->dec_row_mt_sync.mi_rows_parse_done += sb_mi_size;
  frame_row_mt_info->mi_rows_parse_done += sb_mi_size;
#if CONFIG_MULTITHREAD
  // A new decode job is available. Wake up one worker thread to handle the
  // new decode job.
  // NOTE: This assumes we bump mi_rows_parse_done and mi_rows_decode_started
  // by the same increment (sb_mi_size).
  pthread_cond_signal(pbi->row_mt_cond_);
  pthread_mutex_unlock(pbi->row_mt_mutex_);
#endif
}